

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O2

bool __thiscall iDynTree::optimalcontrol::TimeRange::isInRange(TimeRange *this,double time)

{
  bool bVar1;
  byte bVar2;
  double local_20;
  double local_18;
  
  bVar2 = 1;
  if (this->m_anyTime == false) {
    local_20 = time;
    local_18 = time;
    bVar1 = isInstant(this);
    if (bVar1) {
      bVar2 = iDynTree::checkDoublesAreEqual(&this->m_initTime,&local_20,DEFAULT_TOL);
    }
    else {
      bVar2 = -(local_18 <= this->m_endTime) & -(this->m_initTime <= local_18);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool TimeRange::isInRange(double time) const
        {
            if (m_anyTime) {
                return true;
            }

            if (isInstant()) {
                return checkDoublesAreEqual(m_initTime, time);
            }

            return ((m_initTime <= time) && (m_endTime >= time));
        }